

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtMan.c
# Opt level: O0

Cgt_Man_t * Cgt_ManCreate(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Cgt_Man_t *__s;
  Vec_Vec_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  Cgt_Man_t *p;
  Cgt_Par_t *pPars_local;
  Aig_Man_t *pCare_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Saig_ManRegNum(pAig);
  if (iVar1 < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtMan.c"
                  ,0x31,"Cgt_Man_t *Cgt_ManCreate(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *)");
  }
  Aig_ManFanoutStart(pAig);
  Aig_ManSetCioIds(pAig);
  __s = (Cgt_Man_t *)malloc(0xd8);
  memset(__s,0,0xd8);
  __s->pPars = pPars;
  __s->pAig = pAig;
  iVar1 = Saig_ManRegNum(pAig);
  pVVar5 = Vec_VecStart(iVar1);
  __s->vGatesAll = pVVar5;
  pVVar6 = Vec_PtrAlloc(1000);
  __s->vFanout = pVVar6;
  pVVar6 = Vec_PtrAlloc(1000);
  __s->vVisited = pVVar6;
  __s->nPattWords = 0x10;
  if (pCare != (Aig_Man_t *)0x0) {
    iVar1 = Aig_ManCiNum(pCare);
    iVar2 = Aig_ManCiNum(pAig);
    if (iVar1 == iVar2) {
      __s->pCare = pCare;
      pVVar6 = Aig_ManSupportsInverse(__s->pCare);
      __s->vSuppsInv = (Vec_Vec_t *)pVVar6;
    }
    else {
      uVar3 = Aig_ManCiNum(pCare);
      uVar4 = Aig_ManCiNum(pAig);
      printf("The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n",(ulong)uVar3,
             (ulong)uVar4);
    }
  }
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cgt_Man_t * Cgt_ManCreate( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars )
{
    Cgt_Man_t * p;
    // prepare the sequential AIG
    assert( Saig_ManRegNum(pAig) > 0 );
    Aig_ManFanoutStart( pAig );
    Aig_ManSetCioIds( pAig );
    // create interpolation manager
    p = ABC_ALLOC( Cgt_Man_t, 1 ); 
    memset( p, 0, sizeof(Cgt_Man_t) );
    p->pPars      = pPars;
    p->pAig       = pAig;
    p->vGatesAll  = Vec_VecStart( Saig_ManRegNum(pAig) );
    p->vFanout    = Vec_PtrAlloc( 1000 );
    p->vVisited   = Vec_PtrAlloc( 1000 );
    p->nPattWords = 16;
    if ( pCare == NULL )
        return p;
    // check out the constraints
    if ( Aig_ManCiNum(pCare) != Aig_ManCiNum(pAig) )
    {
        printf( "The PI count of care (%d) and AIG (%d) differ. Careset is not used.\n", 
            Aig_ManCiNum(pCare), Aig_ManCiNum(pAig) );
        return p;
    }
    p->pCare = pCare;
    p->vSuppsInv = (Vec_Vec_t *)Aig_ManSupportsInverse( p->pCare );
    return p;
}